

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<float>_>::Subtract
          (TPZMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *A,
          TPZMatrix<std::complex<float>_> *res)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  TPZFMatrixRef<std::complex<float>_> ref;
  TPZFMatrixRef<std::complex<float>_> local_158;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar2 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar3 = __dynamic_cast(res,&TPZMatrix<std::complex<float>>::typeinfo,
                           &TPZFMatrix<std::complex<float>>::typeinfo,0);
    if (lVar3 != 0) {
      lVar3 = __dynamic_cast(A,&TPZMatrix<std::complex<float>>::typeinfo,
                             &TPZFMatrix<std::complex<float>>::typeinfo,0);
      lVar4 = __dynamic_cast(this,&TPZMatrix<std::complex<float>>::typeinfo,
                             &TPZFMatrix<std::complex<float>>::typeinfo,0);
      if ((lVar4 == 0) || (lVar3 == 0)) {
        lVar3 = (this->super_TPZBaseMatrix).fRow;
        if (lVar3 < 1) {
          return;
        }
        lVar4 = (this->super_TPZBaseMatrix).fCol;
        lVar5 = 0;
        do {
          if (0 < lVar4) {
            lVar3 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar5,lVar3);
              (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar5,lVar3);
              local_158.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>
              .super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)
                   CONCAT44(extraout_XMM0_Db - extraout_XMM0_Db_00,
                            extraout_XMM0_Da - extraout_XMM0_Da_00);
              (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (res,lVar5,lVar3,&local_158);
              lVar3 = lVar3 + 1;
              lVar4 = (this->super_TPZBaseMatrix).fCol;
            } while (lVar3 < lVar4);
            lVar3 = (this->super_TPZBaseMatrix).fRow;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar3);
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    Storage(&local_c0,A);
    iVar1 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(res);
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    iVar2 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
    TPZFMatrixRef<std::complex<float>_>::TPZFMatrixRef
              (&local_158,CONCAT44(extraout_var_01,iVar1),
               (complex<float> **)CONCAT44(extraout_var_02,iVar2));
    TPZFMatrix<std::complex<float>_>::operator-=
              (&local_158.super_TPZFMatrix<std::complex<float>_>,
               &local_c0.super_TPZMatrix<std::complex<float>_>);
    TPZFMatrixRef<std::complex<float>_>::~TPZFMatrixRef
              (&local_158,&TPZFMatrixRef<std::complex<float>>::VTT);
    TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMatrix<std::complex<float>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [TVar = std::complex<float>]"
             ,0x7c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n",0x2f);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}